

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(Imputer *a,Imputer *b)

{
  __type _Var1;
  bool bVar2;
  ImputedValueCase IVar3;
  ImputedValueCase IVar4;
  ReplaceValueCase RVar5;
  ReplaceValueCase RVar6;
  uint uVar7;
  int64_t iVar8;
  int64_t iVar9;
  string *psVar10;
  string *psVar11;
  DoubleVector *a_00;
  DoubleVector *b_00;
  Int64Vector *a_01;
  Int64Vector *b_01;
  Int64ToDoubleMap *a_02;
  Int64ToDoubleMap *b_02;
  StringToDoubleMap *a_03;
  StringToDoubleMap *b_03;
  double dVar12;
  double dVar13;
  Imputer *b_local;
  Imputer *a_local;
  
  IVar3 = Imputer::ImputedValue_case(a);
  IVar4 = Imputer::ImputedValue_case(b);
  if (IVar3 != IVar4) {
    return false;
  }
  IVar3 = Imputer::ImputedValue_case(a);
  switch(IVar3) {
  case IMPUTEDVALUE_NOT_SET:
    return true;
  case kImputedDoubleValue:
    dVar12 = Imputer::imputeddoublevalue(a);
    dVar13 = Imputer::imputeddoublevalue(b);
    if ((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) {
      return false;
    }
    break;
  case kImputedInt64Value:
    iVar8 = Imputer::imputedint64value(a);
    iVar9 = Imputer::imputedint64value(b);
    if (iVar8 != iVar9) {
      return false;
    }
    break;
  case kImputedStringValue:
    psVar10 = Imputer::imputedstringvalue_abi_cxx11_(a);
    psVar11 = Imputer::imputedstringvalue_abi_cxx11_(b);
    _Var1 = std::operator==(psVar10,psVar11);
    if (!_Var1) {
      return false;
    }
    break;
  case kImputedDoubleArray:
    a_00 = Imputer::imputeddoublearray(a);
    b_00 = Imputer::imputeddoublearray(b);
    bVar2 = operator==(a_00,b_00);
    if (!bVar2) {
      return false;
    }
    break;
  case kImputedInt64Array:
    a_01 = Imputer::imputedint64array(a);
    b_01 = Imputer::imputedint64array(b);
    bVar2 = operator==(a_01,b_01);
    if (!bVar2) {
      return false;
    }
    break;
  case kImputedStringDictionary:
    a_03 = Imputer::imputedstringdictionary(a);
    b_03 = Imputer::imputedstringdictionary(b);
    bVar2 = operator==(a_03,b_03);
    if (bVar2) {
      return true;
    }
    return false;
  case kImputedInt64Dictionary:
    a_02 = Imputer::imputedint64dictionary(a);
    b_02 = Imputer::imputedint64dictionary(b);
    bVar2 = operator==(a_02,b_02);
    if (!bVar2) {
      return false;
    }
  }
  RVar5 = Imputer::ReplaceValue_case(a);
  RVar6 = Imputer::ReplaceValue_case(b);
  if (RVar5 != RVar6) {
    return false;
  }
  RVar5 = Imputer::ReplaceValue_case(a);
  switch(RVar5) {
  case kReplaceDoubleValue:
    dVar12 = Imputer::replacedoublevalue(a);
    uVar7 = std::isnan(dVar12);
    if ((uVar7 & 1) != 0) {
      dVar12 = Imputer::replacedoublevalue(b);
      uVar7 = std::isnan(dVar12);
      if ((uVar7 & 1) != 0) {
        return true;
      }
    }
    dVar12 = Imputer::replacedoublevalue(a);
    dVar13 = Imputer::replacedoublevalue(b);
    if ((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) {
      return false;
    }
    break;
  case kReplaceInt64Value:
    iVar8 = Imputer::replaceint64value(a);
    iVar9 = Imputer::replaceint64value(b);
    if (iVar8 != iVar9) {
      return false;
    }
  case kReplaceStringValue:
    psVar10 = Imputer::replacestringvalue_abi_cxx11_(a);
    psVar11 = Imputer::replacestringvalue_abi_cxx11_(b);
    bVar2 = std::operator!=(psVar10,psVar11);
    if (bVar2) {
      return false;
    }
  case REPLACEVALUE_NOT_SET:
  }
  return true;
}

Assistant:

bool operator==(const Imputer& a, const Imputer& b) {
            if (a.ImputedValue_case() != b.ImputedValue_case()) {
                return false;
            }

            switch (a.ImputedValue_case()) {
                case Imputer::kImputedDoubleValue:
                    if( !(a.imputeddoublevalue() == b.imputeddoublevalue())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedInt64Value:
                    if(!(a.imputedint64value() == b.imputedint64value())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedStringValue:
                    if(!(a.imputedstringvalue() == b.imputedstringvalue())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedDoubleArray:
                    if(!(a.imputeddoublearray() == b.imputeddoublearray())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedInt64Array:
                    if(!(a.imputedint64array() == b.imputedint64array())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedInt64Dictionary:
                    if(!(a.imputedint64dictionary() == b.imputedint64dictionary())) {
                        return false;
                    }
                    break;
                case Imputer::kImputedStringDictionary:
                    if(!(a.imputedstringdictionary() == b.imputedstringdictionary())) {
                        return false;
                    }
                case Imputer::IMPUTEDVALUE_NOT_SET:
                    // OK to return here, as this just means it's uninitialized.
                    return true;
            }

            // Now test the replacement value.
            if (a.ReplaceValue_case() != b.ReplaceValue_case()) {
                return false;
            }

            switch(a.ReplaceValue_case()) {
                case Imputer::kReplaceDoubleValue: {
                    if( ! ( (std::isnan(a.replacedoublevalue()) && std::isnan(b.replacedoublevalue()))
                           || (a.replacedoublevalue() == b.replacedoublevalue())) ) {
                        return false;
                    }
                    break;
                }
                case Imputer::kReplaceInt64Value: {
                    if(a.replaceint64value() != b.replaceint64value()) {
                        return false;
                    }
                }
                case Imputer::kReplaceStringValue: {
                    if(a.replacestringvalue() != b.replacestringvalue()) {
                        return false;
                    }
                }
                case Imputer::REPLACEVALUE_NOT_SET: {
                    break;
                }
            }

            // Done testing all of this.
            return true;
        }